

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::NestedDescriptorTest_FindNestedTypeByName_Test::
~NestedDescriptorTest_FindNestedTypeByName_Test
          (NestedDescriptorTest_FindNestedTypeByName_Test *this)

{
  (this->super_NestedDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NestedDescriptorTest_018e1230;
  DescriptorPool::~DescriptorPool(&(this->super_NestedDescriptorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x108);
  return;
}

Assistant:

TEST_F(NestedDescriptorTest, FindNestedTypeByName) {
  EXPECT_EQ(foo_, message_->FindNestedTypeByName("Foo"));
  EXPECT_EQ(bar_, message_->FindNestedTypeByName("Bar"));
  EXPECT_EQ(foo2_, message2_->FindNestedTypeByName("Foo"));
  EXPECT_EQ(baz2_, message2_->FindNestedTypeByName("Baz"));

  EXPECT_TRUE(message_->FindNestedTypeByName("NoSuchType") == nullptr);
  EXPECT_TRUE(message_->FindNestedTypeByName("Baz") == nullptr);
  EXPECT_TRUE(message2_->FindNestedTypeByName("Bar") == nullptr);

  EXPECT_TRUE(message_->FindNestedTypeByName("Moo") == nullptr);
}